

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetVisibilityMaskKHR
                   (XrSession session,XrViewConfigurationType viewConfigurationType,
                   uint32_t viewIndex,XrVisibilityMaskTypeKHR visibilityMaskType,
                   XrVisibilityMaskKHR *visibilityMask)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  XrResult XVar3;
  GenValidUsageXrInstanceInfo *instance_info;
  XrResult XVar4;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var5;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar6;
  undefined4 in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd5c;
  string local_2a0;
  string local_280;
  string local_260;
  XrSession session_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_218;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_200;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 2;
  session_local = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&session_local,(XrObjectType *)&oss);
  VVar2 = VerifyXrSessionHandle(&session_local);
  if (VVar2 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>
              ((XrSession_T *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::operator<<((ostream *)&oss,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string
              ((string *)&local_2a0,"VUID-xrGetVisibilityMaskKHR-session-parameter",
               (allocator *)&stack0xfffffffffffffd5f);
    std::__cxx11::string::string
              ((string *)&local_280,"xrGetVisibilityMaskKHR",(allocator *)&stack0xfffffffffffffd5e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2a0,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b8,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b8);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar4 = XR_ERROR_HANDLE_INVALID;
    goto LAB_001ce757;
  }
  pVar6 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session_local);
  instance_info = pVar6.second;
  std::__cxx11::string::string((string *)&oss,"xrGetVisibilityMaskKHR",(allocator *)&local_260);
  std::__cxx11::string::string
            ((string *)&local_2a0,"xrGetVisibilityMaskKHR",(allocator *)&stack0xfffffffffffffd5f);
  std::__cxx11::string::string
            ((string *)&local_280,"viewConfigurationType",(allocator *)&stack0xfffffffffffffd5e);
  bVar1 = ValidateXrEnum(instance_info,(string *)&oss,&local_2a0,&local_280,&objects_info,
                         viewConfigurationType);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&oss);
  if (bVar1) {
    std::__cxx11::string::string((string *)&oss,"xrGetVisibilityMaskKHR",(allocator *)&local_260);
    std::__cxx11::string::string
              ((string *)&local_2a0,"xrGetVisibilityMaskKHR",(allocator *)&stack0xfffffffffffffd5f);
    std::__cxx11::string::string
              ((string *)&local_280,"visibilityMaskType",(allocator *)&stack0xfffffffffffffd5e);
    bVar1 = ValidateXrEnum(instance_info,(string *)&oss,&local_2a0,&local_280,&objects_info,
                           visibilityMaskType);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&oss);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      std::operator<<((ostream *)&oss,
                      "Invalid XrVisibilityMaskTypeKHR \"visibilityMaskType\" enum value ");
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd5c);
      std::operator<<((ostream *)&oss,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::string
                ((string *)&local_2a0,"VUID-xrGetVisibilityMaskKHR-visibilityMaskType-parameter",
                 (allocator *)&stack0xfffffffffffffd5f);
      std::__cxx11::string::string
                ((string *)&local_280,"xrGetVisibilityMaskKHR",(allocator *)&stack0xfffffffffffffd5e
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e8,&objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e8,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      p_Var5 = &local_1e8;
      goto LAB_001ce67f;
    }
    if (visibilityMask == (XrVisibilityMaskKHR *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                 (allocator *)&local_260);
      std::__cxx11::string::string
                ((string *)&local_2a0,"xrGetVisibilityMaskKHR",(allocator *)&stack0xfffffffffffffd5f
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_200,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_280,
                 "Invalid NULL for XrVisibilityMaskKHR \"visibilityMask\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd5e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_200,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      p_Var5 = &local_200;
    }
    else {
      std::__cxx11::string::string((string *)&oss,"xrGetVisibilityMaskKHR",(allocator *)&local_2a0);
      XVar4 = XR_SUCCESS;
      XVar3 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,visibilityMask)
      ;
      std::__cxx11::string::~string((string *)&oss);
      if (XVar3 == XR_SUCCESS) goto LAB_001ce757;
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                 (allocator *)&local_260);
      std::__cxx11::string::string
                ((string *)&local_2a0,"xrGetVisibilityMaskKHR",(allocator *)&stack0xfffffffffffffd5f
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_218,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_280,
                 "Command xrGetVisibilityMaskKHR param visibilityMask is invalid",
                 (allocator *)&stack0xfffffffffffffd5e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_218,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      p_Var5 = &local_218;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(p_Var5);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&oss);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,
                    "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ");
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd5c);
    std::operator<<((ostream *)&oss,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string
              ((string *)&local_2a0,"VUID-xrGetVisibilityMaskKHR-viewConfigurationType-parameter",
               (allocator *)&stack0xfffffffffffffd5f);
    std::__cxx11::string::string
              ((string *)&local_280,"xrGetVisibilityMaskKHR",(allocator *)&stack0xfffffffffffffd5e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_2a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d0,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    p_Var5 = &local_1d0;
LAB_001ce67f:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(p_Var5);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  XVar4 = XR_ERROR_VALIDATION_FAILURE;
LAB_001ce757:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrGetVisibilityMaskKHR(
XrSession session,
XrViewConfigurationType viewConfigurationType,
uint32_t viewIndex,
XrVisibilityMaskTypeKHR visibilityMaskType,
XrVisibilityMaskKHR* visibilityMask) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrGetVisibilityMaskKHR-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrViewConfigurationType value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrGetVisibilityMaskKHR", "xrGetVisibilityMaskKHR", "viewConfigurationType", objects_info, viewConfigurationType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(viewConfigurationType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-viewConfigurationType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Make sure the enum type XrVisibilityMaskTypeKHR value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrGetVisibilityMaskKHR", "xrGetVisibilityMaskKHR", "visibilityMaskType", objects_info, visibilityMaskType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrVisibilityMaskTypeKHR \"visibilityMaskType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(visibilityMaskType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMaskType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == visibilityMask) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR", objects_info,
                                "Invalid NULL for XrVisibilityMaskKHR \"visibilityMask\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrVisibilityMaskKHR is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetVisibilityMaskKHR", objects_info,
                                                        false, true, visibilityMask);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info,
                                "Command xrGetVisibilityMaskKHR param visibilityMask is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}